

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O2

ostream * AixLog::operator<<(ostream *os,TextColor *text_color)

{
  Color CVar1;
  
  std::operator<<(os,"\x1b[");
  CVar1 = text_color->foreground;
  if (text_color->background == NONE && CVar1 == NONE) {
    std::operator<<(os,"0");
    CVar1 = text_color->foreground;
  }
  if (CVar1 != NONE) {
    std::ostream::operator<<(os,CVar1 + 0x1d);
    if (text_color->background == NONE) goto LAB_00112f08;
    std::operator<<(os,";");
  }
  if (text_color->background != NONE) {
    std::ostream::operator<<(os,text_color->background + 0x27);
  }
LAB_00112f08:
  std::operator<<(os,"m");
  return os;
}

Assistant:

static std::ostream& operator<<(std::ostream& os, const TextColor& text_color) {
  os << "\033[";
  if ((text_color.foreground == Color::none) &&
      (text_color.background == Color::none))
    os << "0";  // reset colors if no params

  if (text_color.foreground != Color::none) {
    os << 29 + static_cast<int>(text_color.foreground);
    if (text_color.background != Color::none) os << ";";
  }
  if (text_color.background != Color::none)
    os << 39 + static_cast<int>(text_color.background);
  os << "m";

  return os;
}